

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

Node * mainposition(Table *t,TValue *key)

{
  uint uVar1;
  Node *pNVar2;
  ulong uVar3;
  
  switch(key->tt) {
  case 1:
    uVar1 = ~(-1 << (t->lsizenode & 0x1f)) & (key->value).b;
    break;
  default:
    uVar3 = (ulong)(uint)(key->value).b % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
    goto LAB_00113b50;
  case 3:
    pNVar2 = hashnum(t,(key->value).n);
    return pNVar2;
  case 4:
    uVar1 = ~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((long)(key->value).gc + 0xc);
  }
  uVar3 = (ulong)uVar1;
LAB_00113b50:
  return t->node + uVar3;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TSTRING:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}